

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O3

void QtPrivate::q_relocate_overlap_n_left_move<std::reverse_iterator<QHolder*>,long_long>
               (reverse_iterator<QHolder_*> first,longlong n,reverse_iterator<QHolder_*> d_first)

{
  undefined8 uVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  int *piVar4;
  qsizetype qVar5;
  QHolder *pQVar6;
  QHolder *pQVar7;
  QHolder *pQVar8;
  QHolder *pQVar9;
  long in_FS_OFFSET;
  Destructor local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.end.current = (QHolder *)((d_first.current)->holderName).d.d;
  pQVar7 = local_30.end.current + -n;
  pQVar6 = (QHolder *)((first.current)->holderName).d.d;
  local_30.intermediate.current = local_30.end.current;
  pQVar8 = pQVar7;
  pQVar9 = pQVar6;
  if (pQVar7 < pQVar6) {
    pQVar8 = pQVar6;
    pQVar9 = pQVar7;
  }
  while (local_30.intermediate.current != pQVar8) {
    uVar1 = *(undefined8 *)&pQVar6[-1].holderName.d.d;
    *(undefined8 *)&pQVar6[-1].holderName.d.d = 0;
    *(undefined8 *)&local_30.intermediate.current[-1].holderName.d.d = uVar1;
    pcVar2 = pQVar6[-1].holderName.d.ptr;
    pQVar6[-1].holderName.d.ptr = (char16_t *)0x0;
    local_30.intermediate.current[-1].holderName.d.ptr = pcVar2;
    qVar3 = pQVar6[-1].holderName.d.size;
    qVar5 = pQVar6[-1].holderPos;
    pQVar6[-1].holderName.d.size = 0;
    local_30.intermediate.current[-1].holderName.d.size = qVar3;
    local_30.intermediate.current[-1].holderPos = qVar5;
    ((d_first.current)->holderName).d.d = ((d_first.current)->holderName).d.d + -2;
    pQVar6 = (QHolder *)(((first.current)->holderName).d.d + -2);
    ((first.current)->holderName).d.d = (Data *)pQVar6;
    local_30.intermediate.current = (QHolder *)((d_first.current)->holderName).d.d;
  }
  local_30.iter = &local_30.end;
  pQVar8 = local_30.intermediate.current;
  while (pQVar8 != pQVar7) {
    uVar1 = *(undefined8 *)&pQVar8[-1].holderName.d.d;
    *(undefined8 *)&pQVar8[-1].holderName.d.d = *(undefined8 *)&pQVar6[-1].holderName.d.d;
    *(undefined8 *)&pQVar6[-1].holderName.d.d = uVar1;
    pcVar2 = pQVar8[-1].holderName.d.ptr;
    pQVar8[-1].holderName.d.ptr = pQVar6[-1].holderName.d.ptr;
    pQVar6[-1].holderName.d.ptr = pcVar2;
    qVar3 = pQVar8[-1].holderName.d.size;
    pQVar8[-1].holderName.d.size = pQVar6[-1].holderName.d.size;
    pQVar6[-1].holderName.d.size = qVar3;
    pQVar8[-1].holderPos = pQVar6[-1].holderPos;
    ((d_first.current)->holderName).d.d = ((d_first.current)->holderName).d.d + -2;
    pQVar6 = (QHolder *)(((first.current)->holderName).d.d + -2);
    ((first.current)->holderName).d.d = (Data *)pQVar6;
    pQVar8 = (QHolder *)((d_first.current)->holderName).d.d;
  }
  while (pQVar6 != pQVar9) {
    ((first.current)->holderName).d.d = (Data *)(pQVar6 + 1);
    piVar4 = *(int **)&(pQVar6->holderName).d.d;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        QArrayData::deallocate(*(QArrayData **)&(pQVar6->holderName).d.d,2,0x10);
      }
    }
    pQVar6 = (QHolder *)((first.current)->holderName).d.d;
  }
  q_relocate_overlap_n_left_move<std::reverse_iterator<QHolder_*>,_long_long>::Destructor::
  ~Destructor(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}